

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

bool __thiscall
libcellml::Generator::GeneratorImpl::isXorOperator(GeneratorImpl *this,AnalyserEquationAstPtr *ast)

{
  Type TVar1;
  element_type *this_00;
  element_type *this_01;
  bool local_19;
  AnalyserEquationAstPtr *ast_local;
  GeneratorImpl *this_local;
  
  this_00 = std::
            __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)ast);
  TVar1 = AnalyserEquationAst::type(this_00);
  local_19 = false;
  if (TVar1 == XOR) {
    this_01 = std::
              __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mProfile);
    local_19 = GeneratorProfile::hasXorOperator(this_01);
  }
  return local_19;
}

Assistant:

bool Generator::GeneratorImpl::isXorOperator(const AnalyserEquationAstPtr &ast) const
{
    return (ast->type() == AnalyserEquationAst::Type::XOR)
           && mProfile->hasXorOperator();
}